

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O3

void __thiscall CEntity::~CEntity(CEntity *this)

{
  IServer *pIVar1;
  
  this->_vptr_CEntity = (_func_int **)&PTR__CEntity_001620c0;
  CGameWorld::RemoveEntity(this->m_pGameWorld,this);
  pIVar1 = this->m_pGameWorld->m_pServer;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])(pIVar1,(ulong)(uint)this->m_ID);
  return;
}

Assistant:

CEntity::~CEntity()
{
	GameWorld()->RemoveEntity(this);
	Server()->SnapFreeID(m_ID);
}